

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O0

size_t __thiscall
MMIntern::HttpClient::requestString
          (HttpClient *this,string *url,string *path,string *readBuffer,int timeout,int *http_code)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  undefined8 local_d0;
  long l_http_code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [4];
  CURLcode res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [8];
  string auth;
  curl_slist *headers;
  CURL *curl;
  string local_60 [8];
  string query;
  int *http_code_local;
  int timeout_local;
  string *readBuffer_local;
  string *path_local;
  string *url_local;
  HttpClient *this_local;
  
  *http_code = 0;
  std::__cxx11::string::string(local_60,(string *)url);
  std::__cxx11::string::operator+=(local_60,(string *)path);
  std::__cxx11::string::clear();
  poVar2 = std::operator<<((ostream *)&std::cout,"requesting string from ");
  poVar2 = std::operator<<(poVar2,local_60);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"curl_easy_init failed, cannot query server ");
    poVar2 = std::operator<<(poVar2,(string *)url);
    poVar2 = std::operator<<(poVar2," with query ");
    poVar2 = std::operator<<(poVar2,local_60);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local = (HttpClient *)0x0;
  }
  else {
    uVar4 = curl_slist_append(0,"Content-Type: text/plain");
    curl_easy_setopt(lVar3,0x2727,uVar4);
    uVar4 = std::__cxx11::string::c_str();
    curl_easy_setopt(lVar3,0x2712,uVar4);
    curl_easy_setopt(lVar3,0x4e2b,writeStringCallback);
    curl_easy_setopt(lVar3,0x2711,readBuffer);
    curl_easy_setopt(lVar3,99,1);
    curl_easy_setopt(lVar3,0xd,timeout);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::operator+(local_c0,(char *)&this->user);
        std::operator+(local_a0,local_c0);
        std::__cxx11::string::~string((string *)local_c0);
        uVar4 = std::__cxx11::string::c_str();
        curl_easy_setopt(lVar3,0x2715,uVar4);
        std::__cxx11::string::~string((string *)local_a0);
      }
    }
    l_http_code._4_4_ = curl_easy_perform(lVar3);
    if (l_http_code._4_4_ == 0) {
      local_d0 = 0;
      curl_easy_getinfo(lVar3,0x200002,&local_d0);
      curl_easy_cleanup(lVar3);
      *http_code = (int)local_d0;
      bVar1 = http_server_available(*http_code);
      if (bVar1) {
        this_local = (HttpClient *)std::__cxx11::string::length();
      }
      else {
        std::__cxx11::string::clear();
        poVar2 = std::operator<<((ostream *)&std::cout,"Server ");
        poVar2 = std::operator<<(poVar2,(string *)url);
        poVar2 = std::operator<<(poVar2," with query ");
        poVar2 = std::operator<<(poVar2,local_60);
        poVar2 = std::operator<<(poVar2," replied with code ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*http_code);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        this_local = (HttpClient *)0x0;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"curl_easy_perform() to server ");
      poVar2 = std::operator<<(poVar2,(string *)url);
      poVar2 = std::operator<<(poVar2," with query ");
      poVar2 = std::operator<<(poVar2,local_60);
      poVar2 = std::operator<<(poVar2," failed: ");
      pcVar6 = (char *)curl_easy_strerror(l_http_code._4_4_);
      poVar2 = std::operator<<(poVar2,pcVar6);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local = (HttpClient *)0x0;
    }
  }
  l_http_code._0_4_ = 1;
  std::__cxx11::string::~string(local_60);
  return (size_t)this_local;
}

Assistant:

std::size_t MMIntern::HttpClient::requestString(const std::string& url, const std::string& path, std::string& readBuffer, int timeout, int& http_code)
{
    http_code = 0;
    std::string query(url);
    query += path;
    
    readBuffer.clear();
    
    std::cout << "requesting string from " << query << std::endl;
    CURL* curl = curl_easy_init();
    if(curl)
    {
        struct curl_slist *headers=nullptr; // init to NULL is important
        headers = curl_slist_append(headers, "Content-Type: text/plain");
        
        curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers );
        curl_easy_setopt(curl, CURLOPT_URL, query.c_str());
        curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, writeStringCallback);
        curl_easy_setopt(curl, CURLOPT_WRITEDATA, &readBuffer);
        curl_easy_setopt(curl, CURLOPT_NOSIGNAL, 1);
        curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
        if (!user.empty() && !password.empty())
        {
            const std::string auth=user+":"+password;
            curl_easy_setopt(curl, CURLOPT_USERPWD, auth.c_str());
        }
        
        CURLcode res = curl_easy_perform(curl);
        if(res != CURLE_OK)
        {
            std::cout << "curl_easy_perform() to server " << url << " with query " << query <<" failed: " << curl_easy_strerror(res) << std::endl;
            return 0;
        }
        long l_http_code = 0;
        curl_easy_getinfo (curl, CURLINFO_RESPONSE_CODE, &l_http_code);
        curl_easy_cleanup(curl);
        http_code = static_cast<int>(l_http_code);
        
        if (!http_server_available(http_code))
        {
            readBuffer.clear();
            std::cout << "Server " << url << " with query " << query <<" replied with code " << http_code << std::endl;
            return 0;
        }
        
        return readBuffer.length();
    }
    else
    {
        std::cout << "curl_easy_init failed, cannot query server " << url << " with query " << query << std::endl;
    }
    
    return 0;
}